

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseNat(WastParser *this,uint64_t *out_nat)

{
  Location loc;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result result;
  Literal *pLVar2;
  const_iterator s;
  const_iterator end;
  size_type sVar3;
  const_pointer pcVar4;
  undefined8 in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  undefined1 local_c0 [8];
  string_view sv;
  Token token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  uint64_t *local_20;
  uint64_t *out_nat_local;
  WastParser *this_local;
  
  local_20 = out_nat;
  out_nat_local = (uint64_t *)this;
  bVar1 = PeekMatch(this,Last_Literal);
  if (bVar1) {
    Consume((Token *)&sv.size_,this);
    pLVar2 = Token::literal((Token *)&sv.size_);
    local_c0 = (undefined1  [8])(pLVar2->text).data_;
    sv.data_ = (char *)(pLVar2->text).size_;
    s = string_view::begin((string_view *)local_c0);
    end = string_view::end((string_view *)local_c0);
    result = ParseUint64(s,end,local_20);
    bVar1 = Failed(result);
    if (bVar1) {
      sVar3 = string_view::length((string_view *)local_c0);
      pcVar4 = string_view::data((string_view *)local_c0);
      loc.filename.size_ = (size_type)token.loc.filename.data_;
      loc.filename.data_ = (char *)sv.size_;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           token.loc.filename.size_;
      loc.field_1._8_8_ = token.loc.field_1.field_1.offset;
      Error(this,loc,"invalid int \"%.*s\"",sVar3 & 0xffffffff,pcVar4,token.loc.filename.size_,in_R9
           );
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_68,"a natural number",
               (allocator *)((long)&token.field_2.literal_.text.size_ + 7));
    local_48 = &local_68;
    local_40 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&token.field_2.literal_.text.size_ + 6));
    __l._M_len = local_40;
    __l._M_array = local_48;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_38,__l,(allocator_type *)((long)&token.field_2.literal_.text.size_ + 6));
    this_local._4_4_ = ErrorExpected(this,&local_38,"123");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&token.field_2.literal_.text.size_ + 6));
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
    do {
      local_f8 = local_f8 + -1;
      std::__cxx11::string::~string((string *)local_f8);
    } while (local_f8 != &local_68);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text.size_ + 7));
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseNat(uint64_t* out_nat) {
  WABT_TRACE(ParseNat);
  if (!PeekMatch(TokenType::Nat)) {
    return ErrorExpected({"a natural number"}, "123");
  }

  Token token = Consume();
  string_view sv = token.literal().text;
  if (Failed(ParseUint64(sv.begin(), sv.end(), out_nat))) {
    Error(token.loc, "invalid int \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(sv));
  }

  return Result::Ok;
}